

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O1

int gena_unsubscribe(UpnpString *url,UpnpString *sid,http_parser_t *response)

{
  int iVar1;
  char *pcVar2;
  size_t urlstrlen;
  membuffer request;
  uri_type dest_url;
  
  pcVar2 = UpnpString_get_String(url);
  urlstrlen = UpnpString_get_Length(url);
  iVar1 = http_FixStrUrl(pcVar2,urlstrlen,&dest_url);
  if (iVar1 == 0) {
    membuffer_init(&request);
    request.size_inc = 0x1e;
    pcVar2 = UpnpString_get_String(sid);
    iVar1 = http_MakeMessage(&request,1,1,"qsscUc",7,&dest_url,"SID: ",pcVar2);
    if (iVar1 == 0) {
      iVar1 = http_RequestAndResponse
                        (&dest_url,request.buf,request.length,HTTPMETHOD_UNSUBSCRIBE,0x1e,response);
      membuffer_destroy(&request);
      if (iVar1 == 0) {
        iVar1 = 0;
        if ((response->msg).status_code != 200) {
          httpmsg_destroy(&response->msg);
          iVar1 = -0x12e;
        }
      }
      else {
        httpmsg_destroy(&response->msg);
      }
    }
    else {
      membuffer_destroy(&request);
    }
  }
  return iVar1;
}

Assistant:

static int gena_unsubscribe(
	/*! [in] Event URL of the service. */
	const UpnpString *url,
	/*! [in] The subcription ID. */
	const UpnpString *sid,
	/*! [out] The UNSUBCRIBE response from the device. */
	http_parser_t *response)
{
	int return_code;
	uri_type dest_url;
	membuffer request;

	/* parse url */
	return_code = http_FixStrUrl(UpnpString_get_String(url),
		UpnpString_get_Length(url),
		&dest_url);
	if (return_code != 0) {
		return return_code;
	}

	/* make request msg */
	membuffer_init(&request);
	request.size_inc = 30;
	return_code = http_MakeMessage(&request,
		1,
		1,
		"q"
		"ssc"
		"Uc",
		HTTPMETHOD_UNSUBSCRIBE,
		&dest_url,
		"SID: ",
		UpnpString_get_String(sid));

	/* Not able to make the message so destroy the existing buffer */
	if (return_code != 0) {
		membuffer_destroy(&request);

		return return_code;
	}

	/* send request and get reply */
	return_code = http_RequestAndResponse(&dest_url,
		request.buf,
		request.length,
		HTTPMETHOD_UNSUBSCRIBE,
		HTTP_DEFAULT_TIMEOUT,
		response);
	membuffer_destroy(&request);
	if (return_code != 0) {
		httpmsg_destroy(&response->msg);
	}

	if (return_code == 0 && response->msg.status_code != HTTP_OK) {
		return_code = UPNP_E_UNSUBSCRIBE_UNACCEPTED;
		httpmsg_destroy(&response->msg);
	}

	return return_code;
}